

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O2

CURLcode ossl_connect_common(Curl_cfilter *cf,Curl_easy *data,_Bool nonblocking,_Bool *done)

{
  void *pvVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  curl_trc_feat *pcVar4;
  ossl_ctx *octx;
  ssl_peer *psVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  CURLcode CVar9;
  uint err;
  timediff_t tVar10;
  ssl_config_data *psVar11;
  long lVar12;
  char *pcVar13;
  char *pcVar14;
  SSL_CIPHER *c;
  char *pcVar15;
  char *pcVar16;
  size_t alpn_len;
  BIO_METHOD *type;
  BIO *pBVar17;
  uint *puVar18;
  ulong error;
  int *piVar19;
  int *local_1a8;
  uint local_194;
  _Bool *local_190;
  int psigtype_nid;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  uchar *neg_protocol;
  char acStack_130 [24];
  undefined8 local_118;
  
  pvVar1 = cf->ctx;
  uVar6 = Curl_conn_cf_get_socket(cf,data);
  *(undefined4 *)((long)pvVar1 + 0x58) = 0;
  if (*(int *)((long)pvVar1 + 0x50) == 2) {
    *done = true;
  }
  else {
    local_190 = done;
    if (*(int *)((long)pvVar1 + 0x54) == 0) {
      tVar10 = Curl_timeleft(data,(curltime *)0x0,true);
      if (tVar10 < 0) {
LAB_00166b32:
        Curl_failf(data,"SSL connection timeout");
        return CURLE_OPERATION_TIMEDOUT;
      }
      psVar5 = (ssl_peer *)cf->ctx;
      octx = (ossl_ctx *)psVar5[1].dispname;
      local_118._0_1_ = '\0';
      local_118._1_3_ = 0;
      local_118._4_4_ = 0;
      acStack_130[8] = '\0';
      acStack_130[9] = '\0';
      acStack_130[10] = '\0';
      acStack_130[0xb] = '\0';
      acStack_130[0xc] = '\0';
      acStack_130[0xd] = '\0';
      acStack_130[0xe] = '\0';
      acStack_130[0xf] = '\0';
      acStack_130[0x10] = '\0';
      acStack_130[0x11] = '\0';
      acStack_130[0x12] = '\0';
      acStack_130[0x13] = '\0';
      acStack_130[0x14] = '\0';
      acStack_130[0x15] = '\0';
      acStack_130[0x16] = '\0';
      acStack_130[0x17] = '\0';
      neg_protocol = (uchar *)0x0;
      acStack_130[0] = '\0';
      acStack_130[1] = '\0';
      acStack_130[2] = '\0';
      acStack_130[3] = '\0';
      acStack_130[4] = '\0';
      acStack_130[5] = '\0';
      acStack_130[6] = '\0';
      acStack_130[7] = '\0';
      if ((alpn_spec *)psVar5[1].hostname == (alpn_spec *)0x0) {
        alpn_len = 0;
      }
      else {
        CVar9 = Curl_alpn_to_proto_buf
                          ((alpn_proto_buf *)&neg_protocol,(alpn_spec *)psVar5[1].hostname);
        if (CVar9 != CURLE_OK) {
          Curl_failf(data,"Error determining ALPN");
          return CURLE_SSL_CONNECT_ERROR;
        }
        alpn_len = (size_t)local_118._4_4_;
      }
      CVar9 = Curl_ossl_ctx_init(octx,cf,data,psVar5,3,(uchar *)&neg_protocol,alpn_len,
                                 (Curl_ossl_ctx_setup_cb *)0x0,(void *)0x0,ossl_new_session_cb,cf);
      if (CVar9 != CURLE_OK) {
        return CVar9;
      }
      type = (BIO_METHOD *)BIO_meth_new(0x401,"OpenSSL CF BIO");
      if (type == (BIO_METHOD *)0x0) {
        octx->bio_method = (BIO_METHOD *)0x0;
        return CURLE_OUT_OF_MEMORY;
      }
      BIO_meth_set_write(type,ossl_bio_cf_out_write);
      BIO_meth_set_read(type,ossl_bio_cf_in_read);
      BIO_meth_set_ctrl(type,ossl_bio_cf_ctrl);
      BIO_meth_set_create(type,ossl_bio_cf_create);
      BIO_meth_set_destroy(type,ossl_bio_cf_destroy);
      octx->bio_method = (BIO_METHOD *)type;
      pBVar17 = BIO_new(type);
      if (pBVar17 == (BIO *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      BIO_set_data(pBVar17,cf);
      BIO_up_ref(pBVar17);
      SSL_set0_rbio(octx->ssl,pBVar17);
      SSL_set0_wbio(octx->ssl,pBVar17);
      if (((((alpn_spec *)psVar5[1].hostname != (alpn_spec *)0x0) &&
           (Curl_alpn_to_proto_str((alpn_proto_buf *)&neg_protocol,(alpn_spec *)psVar5[1].hostname),
           data != (Curl_easy *)0x0)) && (((data->set).field_0x8cd & 0x10) != 0)) &&
         ((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 || (0 < pcVar4->log_level))))
      {
        Curl_infof(data,"ALPN: curl offers %s",&neg_protocol);
      }
      *(undefined4 *)((long)&psVar5[2].hostname + 4) = 1;
    }
    local_1a8 = &psigtype_nid;
    do {
      iVar7 = *(int *)((long)pvVar1 + 0x54);
      if (iVar7 != 1) {
        if (iVar7 == 2) {
          psVar5 = (ssl_peer *)cf->ctx;
          CVar9 = Curl_oss_check_peer_cert(cf,data,(ossl_ctx *)psVar5[1].dispname,psVar5);
          if (CVar9 != CURLE_OK) {
            return CVar9;
          }
          *(undefined4 *)((long)&psVar5[2].hostname + 4) = 3;
          iVar7 = *(int *)((long)pvVar1 + 0x54);
        }
        if (iVar7 == 3) {
          *(undefined4 *)((long)pvVar1 + 0x50) = 2;
        }
        *local_190 = iVar7 == 3;
        *(undefined4 *)((long)pvVar1 + 0x54) = 0;
        return CURLE_OK;
      }
      tVar10 = Curl_timeleft(data,(curltime *)0x0,true);
      if (tVar10 < 0) goto LAB_00166b32;
      if ((!nonblocking) && (uVar8 = *(uint *)((long)pvVar1 + 0x58), uVar8 != 0)) {
        iVar7 = Curl_socket_check(-(uint)((uVar8 & 1) == 0) | uVar6,-1,
                                  -(uint)((uVar8 & 2) == 0) | uVar6,tVar10);
        if (iVar7 < 0) {
          puVar18 = (uint *)__errno_location();
          Curl_failf(data,"select/poll on SSL socket, errno: %d",(ulong)*puVar18);
          return CURLE_SSL_CONNECT_ERROR;
        }
        if (iVar7 == 0) goto LAB_00166b32;
      }
      puVar2 = (undefined8 *)cf->ctx;
      puVar3 = (undefined8 *)puVar2[6];
      psVar11 = Curl_ssl_cf_get_config(cf,data);
      *(undefined4 *)(puVar2 + 0xb) = 0;
      ERR_clear_error();
      uVar8 = SSL_connect((SSL *)puVar3[1]);
      if ((*(byte *)((long)puVar3 + 0x25) & 1) == 0) {
        CVar9 = Curl_ssl_setup_x509_store(cf,data,(SSL_CTX *)*puVar3);
        if (CVar9 != CURLE_OK) {
          return CVar9;
        }
        *(byte *)((long)puVar3 + 0x25) = *(byte *)((long)puVar3 + 0x25) | 1;
      }
      if (uVar8 == 1) {
        _psigtype_nid = _psigtype_nid & 0xffffffff00000000;
        *(undefined4 *)((long)puVar2 + 0x54) = 2;
        SSL_get_peer_signature_type_nid(puVar3[1],&psigtype_nid);
        lVar12 = SSL_ctrl((SSL *)puVar3[1],0x86,0,(void *)0x0);
        pcVar13 = OBJ_nid2sn((uint)lVar12 & 0xffff);
        if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
           ((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 || (0 < pcVar4->log_level))
           )) {
          pcVar14 = SSL_get_version((SSL *)puVar3[1]);
          c = SSL_get_current_cipher((SSL *)puVar3[1]);
          pcVar15 = SSL_CIPHER_get_name(c);
          if (pcVar13 == (char *)0x0) {
            pcVar13 = "[blank]";
          }
          pcVar16 = OBJ_nid2sn(psigtype_nid);
          Curl_infof(data,"SSL connection using %s / %s / %s / %s",pcVar14,pcVar15,pcVar13,pcVar16);
        }
        if (puVar2[5] != 0) {
          SSL_get0_alpn_selected(puVar3[1],&neg_protocol,&local_194);
          CVar9 = Curl_alpn_set_negotiated(cf,data,neg_protocol,(ulong)local_194);
          if (CVar9 != CURLE_OK) {
            return CVar9;
          }
        }
      }
      else {
        err = SSL_get_error((SSL *)puVar3[1],uVar8);
        if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
            ((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 || (0 < pcVar4->log_level)
             ))) && (0 < cf->cft->log_level)) {
          Curl_trc_cf_infof(data,cf,"SSL_connect() -> err=%d, detail=%d",(ulong)uVar8,(ulong)err);
        }
        if (err == 0xc) {
          if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
             (((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 ||
               (0 < pcVar4->log_level)) && (0 < cf->cft->log_level)))) {
            pcVar13 = "SSL_connect() -> want retry_verify";
LAB_00166a90:
            Curl_trc_cf_infof(data,cf,pcVar13);
          }
LAB_00166a97:
          *(undefined8 *)((long)puVar2 + 0x54) = 0x100000001;
        }
        else if (err == 3) {
          if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
              ((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 ||
               (0 < pcVar4->log_level)))) && (0 < cf->cft->log_level)) {
            Curl_trc_cf_infof(data,cf,"SSL_connect() -> want send");
          }
          *(undefined4 *)(puVar2 + 0xb) = 2;
        }
        else {
          if (err == 9) {
            if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
                ((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 ||
                 (0 < pcVar4->log_level)))) && (0 < cf->cft->log_level)) {
              pcVar13 = "SSL_connect() -> want async";
              goto LAB_00166a90;
            }
            goto LAB_00166a97;
          }
          if (err != 2) {
            memset(&neg_protocol,0,0x100);
            *(undefined4 *)((long)puVar2 + 0x54) = 1;
            error = ERR_get_error();
            uVar6 = (uint)error;
            if ((uVar6 & 0xff800000) == 0xa000000 && -1 < (int)uVar6) {
              uVar6 = uVar6 & 0x7fffff;
              if (uVar6 != 0x86) {
                if (uVar6 == 0x45c) {
                  ossl_strerror(error,(char *)&neg_protocol,0x100);
                  CVar9 = CURLE_SSL_CLIENTCERT;
                  goto LAB_00166edb;
                }
                if (uVar6 != 0x415) goto LAB_00166dfc;
              }
              lVar12 = SSL_get_verify_result((SSL *)puVar3[1]);
              if (lVar12 == 0) {
                builtin_strncpy(acStack_130 + 8,"verification fai",0x10);
                neg_protocol = (uchar *)0x74726563204c5353;
                builtin_strncpy(acStack_130,"ificate ",8);
                local_118._0_4_ = 0x64656c;
              }
              else {
                psVar11->certverifyresult = lVar12;
                pcVar13 = X509_verify_cert_error_string(lVar12);
                curl_msnprintf((char *)&neg_protocol,0x100,"SSL certificate problem: %s",pcVar13);
              }
              CVar9 = CURLE_PEER_FAILED_VERIFICATION;
LAB_00166edb:
              Curl_failf(data,"%s",&neg_protocol);
              return CVar9;
            }
LAB_00166dfc:
            ossl_strerror(error,(char *)&neg_protocol,0x100);
            if (error != 0) {
              CVar9 = CURLE_SSL_CONNECT_ERROR;
              goto LAB_00166edb;
            }
            local_148 = 0;
            uStack_140 = 0;
            local_158 = 0;
            uStack_150 = 0;
            local_168 = 0;
            uStack_160 = 0;
            local_178 = 0;
            uStack_170 = 0;
            _psigtype_nid = 0;
            uStack_180 = 0;
            piVar19 = __errno_location();
            if ((*piVar19 != 0) && (err == 5)) {
              Curl_strerror(*piVar19,(char *)&psigtype_nid,0x50);
              if ((char)psigtype_nid != '\0') goto LAB_00166e74;
            }
            local_1a8 = (int *)SSL_ERROR_to_str(err);
LAB_00166e74:
            Curl_failf(data,"OpenSSL SSL_connect: %s in connection to %s:%d ",local_1a8,*puVar2,
                       (ulong)*(uint *)((long)puVar2 + 0x1c));
            return CURLE_SSL_CONNECT_ERROR;
          }
          if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
             (((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 ||
               (0 < pcVar4->log_level)) && (0 < cf->cft->log_level)))) {
            Curl_trc_cf_infof(data,cf,"SSL_connect() -> want recv");
          }
          *(undefined4 *)(puVar2 + 0xb) = 1;
        }
      }
    } while ((!nonblocking) || (*(int *)((long)pvVar1 + 0x54) != 1));
  }
  return CURLE_OK;
}

Assistant:

static CURLcode ossl_connect_common(struct Curl_cfilter *cf,
                                    struct Curl_easy *data,
                                    bool nonblocking,
                                    bool *done)
{
  CURLcode result = CURLE_OK;
  struct ssl_connect_data *connssl = cf->ctx;
  curl_socket_t sockfd = Curl_conn_cf_get_socket(cf, data);
  int what;

  connssl->io_need = CURL_SSL_IO_NEED_NONE;
  /* check if the connection has already been established */
  if(ssl_connection_complete == connssl->state) {
    *done = TRUE;
    return CURLE_OK;
  }

  if(ssl_connect_1 == connssl->connecting_state) {
    /* Find out how much more time we are allowed */
    const timediff_t timeout_ms = Curl_timeleft(data, NULL, TRUE);

    if(timeout_ms < 0) {
      /* no need to continue if time is already up */
      failf(data, "SSL connection timeout");
      return CURLE_OPERATION_TIMEDOUT;
    }

    result = ossl_connect_step1(cf, data);
    if(result)
      goto out;
  }

  while(ssl_connect_2 == connssl->connecting_state) {

    /* check allowed time left */
    const timediff_t timeout_ms = Curl_timeleft(data, NULL, TRUE);

    if(timeout_ms < 0) {
      /* no need to continue if time already is up */
      failf(data, "SSL connection timeout");
      result = CURLE_OPERATION_TIMEDOUT;
      goto out;
    }

    /* if ssl is expecting something, check if it is available. */
    if(!nonblocking && connssl->io_need) {

      curl_socket_t writefd = (connssl->io_need & CURL_SSL_IO_NEED_SEND)?
                              sockfd:CURL_SOCKET_BAD;
      curl_socket_t readfd = (connssl->io_need & CURL_SSL_IO_NEED_RECV)?
                             sockfd:CURL_SOCKET_BAD;

      what = Curl_socket_check(readfd, CURL_SOCKET_BAD, writefd,
                               timeout_ms);
      if(what < 0) {
        /* fatal error */
        failf(data, "select/poll on SSL socket, errno: %d", SOCKERRNO);
        result = CURLE_SSL_CONNECT_ERROR;
        goto out;
      }
      if(0 == what) {
        /* timeout */
        failf(data, "SSL connection timeout");
        result = CURLE_OPERATION_TIMEDOUT;
        goto out;
      }
      /* socket is readable or writable */
    }

    /* Run transaction, and return to the caller if it failed or if this
     * connection is done nonblocking and this loop would execute again. This
     * permits the owner of a multi handle to abort a connection attempt
     * before step2 has completed while ensuring that a client using select()
     * or epoll() will always have a valid fdset to wait on.
     */
    result = ossl_connect_step2(cf, data);
    if(result || (nonblocking && (ssl_connect_2 == connssl->connecting_state)))
      goto out;

  } /* repeat step2 until all transactions are done. */

  if(ssl_connect_3 == connssl->connecting_state) {
    result = ossl_connect_step3(cf, data);
    if(result)
      goto out;
  }

  if(ssl_connect_done == connssl->connecting_state) {
    connssl->state = ssl_connection_complete;
    *done = TRUE;
  }
  else
    *done = FALSE;

  /* Reset our connect state machine */
  connssl->connecting_state = ssl_connect_1;

out:
  return result;
}